

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MathUtil.h
# Opt level: O2

uint32 Math::PopCnt32(uint32 x)

{
  return POPCOUNT(x);
}

Assistant:

static uint32 PopCnt32(uint32 x)
    {
        // sum set bits in every bit pair
        x -= (x >> 1) & 0x55555555u;
        // sum pairs into quads
        x = (x & 0x33333333u) + ((x >> 2) & 0x33333333u);
        // sum quads into octets
        x = (x + (x >> 4)) & 0x0f0f0f0fu;
        // sum octets into topmost octet
        x *= 0x01010101u;
        return x >> 24;
    }